

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVStreambuf.h
# Opt level: O2

void __thiscall
cmBasicUVStreambuf<char,_std::char_traits<char>_>::cmBasicUVStreambuf
          (cmBasicUVStreambuf<char,_std::char_traits<char>_> *this,size_t bufSize,size_t putBack)

{
  size_type __n;
  ulong uVar1;
  allocator_type local_21;
  
  std::streambuf::streambuf((streambuf *)this);
  *(undefined ***)this = &PTR__cmBasicUVStreambuf_005c50e8;
  uVar1 = putBack + (putBack == 0);
  this->Stream = (uv_stream_t *)0x0;
  this->OldStreamData = (void *)0x0;
  this->PutBack = uVar1;
  if (bufSize < uVar1) {
    bufSize = uVar1;
  }
  __n = bufSize + uVar1;
  std::vector<char,_std::allocator<char>_>::vector(&this->InputBuffer,__n,&local_21);
  this->EndOfFile = false;
  close(this,(int)__n);
  return;
}

Assistant:

cmBasicUVStreambuf<CharT, Traits>::cmBasicUVStreambuf(std::size_t bufSize,
                                                      std::size_t putBack)
  : PutBack(std::max<std::size_t>(putBack, 1))
  , InputBuffer(std::max<std::size_t>(this->PutBack, bufSize) + this->PutBack)
{
  this->close();
}